

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osTime.cpp
# Opt level: O0

uint64_t osTime::GetTime(void)

{
  uint64_t rc;
  timespec ts;
  
  clock_gettime(1,(timespec *)&rc);
  return rc * 1000000 + ts.tv_sec / 1000;
}

Assistant:

uint64_t osTime::GetTime()
{
#ifdef _WIN32
    FILETIME ftime;
    uint64_t time;

    // Time in 100ns ticks
    GetSystemTimeAsFileTime(&ftime);

    time = ftime.dwHighDateTime;
    time <<= 32;
    time += ftime.dwLowDateTime;

    return time;
#elif __linux__
    timespec ts;
    clock_gettime(CLOCK_MONOTONIC, &ts);
    uint64_t rc = ts.tv_sec * 1000000 + (ts.tv_nsec / 1000);
    return rc;
#endif
}